

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O2

string * CLI::AsNumberWithUnit::generate_description<int>
                   (string *__return_storage_ptr__,string *name,Options opts)

{
  ostream *poVar1;
  stringstream out;
  ostream local_198 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&out);
  poVar1 = ::std::operator<<(local_198,"INT");
  ::std::operator<<(poVar1,' ');
  if ((opts & UNIT_REQUIRED) == CASE_SENSITIVE) {
    poVar1 = ::std::operator<<(local_198,'[');
    poVar1 = ::std::operator<<(poVar1,(string *)name);
    ::std::operator<<(poVar1,']');
  }
  else {
    ::std::operator<<(local_198,(string *)name);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

static std::string generate_description(const std::string &name, Options opts) {
        std::stringstream out;
        out << detail::type_name<Number>() << ' ';
        if(opts & UNIT_REQUIRED) {
            out << name;
        } else {
            out << '[' << name << ']';
        }
        return out.str();
    }